

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BtreeGetRequestedReserve(Btree *p)

{
  uint uVar1;
  Btree *in_RDI;
  int n2;
  int n1;
  uint local_14;
  
  sqlite3BtreeEnter((Btree *)0x14eff3);
  uVar1 = (uint)in_RDI->pBt->nReserveWanted;
  local_14 = sqlite3BtreeGetReserveNoMutex(in_RDI);
  sqlite3BtreeLeave((Btree *)0x14f01c);
  if ((int)local_14 < (int)uVar1) {
    local_14 = uVar1;
  }
  return local_14;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeGetRequestedReserve(Btree *p){
  int n1, n2;
  sqlite3BtreeEnter(p);
  n1 = (int)p->pBt->nReserveWanted;
  n2 = sqlite3BtreeGetReserveNoMutex(p);
  sqlite3BtreeLeave(p);
  return n1>n2 ? n1 : n2;
}